

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

int reason_code_to_str(char *str,size_t len,http_reason_code_t rt)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  char *__s;
  
  pcVar3 = reason_code_name[5];
  pcVar2 = reason_code_name[4];
  __s = reason_code_name[3];
  pcVar1 = reason_code_name[0];
  if (rt == OK) {
    sVar4 = strlen(reason_code_name[3]);
    if (len <= sVar4) {
      return 3;
    }
  }
  else if (rt == Not_implemented) {
    sVar4 = strlen(reason_code_name[5]);
    __s = pcVar3;
    if (len <= sVar4) {
      return 5;
    }
  }
  else {
    __s = reason_code_name[1];
    if ((rt == Not_found) || (__s = reason_code_name[2], rt == Entity_Too_Large)) {
      sVar4 = strlen(__s);
      if (len <= sVar4) {
        return 2;
      }
    }
    else if (rt == Internal_Error) {
      sVar4 = strlen(reason_code_name[4]);
      __s = pcVar2;
      if (len <= sVar4) {
        return 4;
      }
    }
    else {
      if (rt != Bad_Request) {
        return 0;
      }
      sVar4 = strlen(reason_code_name[0]);
      __s = pcVar1;
      if (len <= sVar4) {
        return 1;
      }
    }
  }
  strcpy(str,__s);
  return 0;
}

Assistant:

int reason_code_to_str(char *str, size_t len, http_reason_code_t rt)
{

  size_t reason_code_size;

  switch(rt)
    {
    case Bad_Request:
      reason_code_size=strlen(reason_code_name[0]);
      if(len <= reason_code_size)
        return 1;
      strcpy(str, reason_code_name[0]);
      break;
    case Not_found:
      reason_code_size=strlen(reason_code_name[1]);
      if(len <= reason_code_size)
        return 2;
      strcpy(str,reason_code_name[1]);
      break;
    case Entity_Too_Large:
      reason_code_size=strlen(reason_code_name[2]);
      if(len <= reason_code_size)
        return 2;
      strcpy(str,reason_code_name[2]);
      break;
    case OK:
      reason_code_size=strlen(reason_code_name[3]);
      if(len <= reason_code_size)
        return 3;
      strcpy(str,reason_code_name[3]);
      break;
    case Internal_Error:
      reason_code_size=strlen(reason_code_name[4]);
      if(len <= reason_code_size)
        return 4;
      strcpy(str,reason_code_name[4]);
      break;
    case Not_implemented:
      reason_code_size=strlen(reason_code_name[5]);
      if(len <= reason_code_size)
        return 5;
      strcpy(str,reason_code_name[5]);
      break;
    }
  return 0;
}